

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O2

void __thiscall efsw::DirectorySnapshot::removeFile(DirectorySnapshot *this,string *path)

{
  iterator __position;
  string name;
  string sStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)path);
  FileSystem::fileNameFromPath(&sStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
               ::find(&(this->Files)._M_t,&sStack_58);
  if (&(this->Files)._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)__position._M_node) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,efsw::FileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,efsw::FileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,efsw::FileInfo>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,efsw::FileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,efsw::FileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,efsw::FileInfo>>>
                        *)&this->Files,__position);
  }
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void DirectorySnapshot::removeFile( std::string path ) {
	std::string name( FileSystem::fileNameFromPath( path ) );

	FileInfoMap::iterator it = Files.find( name );

	if ( Files.end() != it ) {
		Files.erase( it );
	}
}